

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O1

void stbir__resample_horizontal_upsample(stbir__info *stbir_info,float *output_buffer)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  stbir__contributors *psVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  float *pfVar21;
  
  iVar2 = stbir_info->output_w;
  if (0 < (long)iVar2) {
    uVar3 = stbir_info->channels;
    lVar11 = (long)(int)uVar3;
    pfVar7 = stbir_info->decode_buffer;
    lVar15 = (long)(int)(stbir_info->horizontal_filter_pixel_margin * uVar3);
    psVar8 = stbir_info->horizontal_contributors;
    pfVar9 = stbir_info->horizontal_coefficients;
    iVar4 = stbir_info->horizontal_coefficient_width;
    lVar12 = 0;
    pfVar13 = output_buffer;
    pfVar14 = pfVar9;
    do {
      iVar5 = psVar8[lVar12].n0;
      lVar20 = (long)iVar5;
      iVar6 = psVar8[lVar12].n1;
      if (iVar6 < iVar5) {
        __assert_fail("n1 >= n0",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b5,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      iVar17 = stbir_info->horizontal_filter_pixel_margin;
      if (SBORROW4(iVar5,-iVar17) != iVar5 + iVar17 < 0) {
        __assert_fail("n0 >= -stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b6,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (SBORROW4(iVar6,-iVar17) != iVar6 + iVar17 < 0) {
        __assert_fail("n1 >= -stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b7,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      iVar17 = iVar17 + stbir_info->input_w;
      if (iVar17 <= iVar5) {
        __assert_fail("n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b8,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (iVar17 <= iVar6) {
        __assert_fail("n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin",
                      "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                      ,0x5b9,"void stbir__resample_horizontal_upsample(stbir__info *, float *)");
      }
      if (uVar3 - 1 < 4) {
        lVar18 = lVar12 * lVar11;
        switch(uVar3) {
        case 1:
          if (iVar5 <= iVar6) {
            uVar19 = 0;
            do {
              fVar1 = pfVar14[uVar19];
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                __assert_fail("coefficient != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                              ,0x5c1,
                              "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
              }
              lVar10 = lVar20 + uVar19;
              uVar19 = uVar19 + 1;
              output_buffer[lVar18] = fVar1 * pfVar7[lVar15 + lVar10] + output_buffer[lVar18];
            } while ((iVar6 - iVar5) + 1 != uVar19);
          }
          break;
        case 2:
          if (iVar5 <= iVar6) {
            uVar19 = 0;
            do {
              fVar1 = pfVar14[uVar19];
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                __assert_fail("coefficient != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                              ,0x5ca,
                              "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
              }
              output_buffer[lVar18] =
                   pfVar7[lVar15 + lVar20 * 2 + uVar19 * 2] * fVar1 + output_buffer[lVar18];
              lVar10 = uVar19 * 2;
              uVar19 = uVar19 + 1;
              output_buffer[lVar18 + 1] =
                   fVar1 * pfVar7[lVar15 + lVar20 * 2 + lVar10 + 1] + output_buffer[lVar18 + 1];
            } while ((iVar6 - iVar5) + 1 != uVar19);
          }
          break;
        case 3:
          if (iVar5 <= iVar6) {
            pfVar21 = pfVar7 + lVar15 + lVar20 * 3 + 2;
            uVar19 = 0;
            do {
              fVar1 = pfVar14[uVar19];
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                __assert_fail("coefficient != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                              ,0x5d4,
                              "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
              }
              output_buffer[lVar18] = pfVar21[-2] * fVar1 + output_buffer[lVar18];
              output_buffer[lVar18 + 1] = pfVar21[-1] * fVar1 + output_buffer[lVar18 + 1];
              uVar19 = uVar19 + 1;
              output_buffer[lVar18 + 2] = fVar1 * *pfVar21 + output_buffer[lVar18 + 2];
              pfVar21 = pfVar21 + 3;
            } while ((iVar6 - iVar5) + 1 != uVar19);
          }
          break;
        case 4:
          if (iVar5 <= iVar6) {
            pfVar21 = pfVar7 + lVar15 + lVar20 * 4 + 3;
            uVar19 = 0;
            do {
              fVar1 = pfVar14[uVar19];
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                __assert_fail("coefficient != 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                              ,0x5df,
                              "void stbir__resample_horizontal_upsample(stbir__info *, float *)");
              }
              output_buffer[lVar18] = pfVar21[-3] * fVar1 + output_buffer[lVar18];
              output_buffer[lVar18 + 1] = pfVar21[-2] * fVar1 + output_buffer[lVar18 + 1];
              output_buffer[lVar18 + 2] = pfVar21[-1] * fVar1 + output_buffer[lVar18 + 2];
              uVar19 = uVar19 + 1;
              output_buffer[lVar18 + 3] = fVar1 * *pfVar21 + output_buffer[lVar18 + 3];
              pfVar21 = pfVar21 + 4;
            } while ((iVar6 - iVar5) + 1 != uVar19);
          }
        }
      }
      else if (iVar5 <= iVar6) {
        lVar20 = (long)pfVar7 + lVar20 * lVar11 * 4 + lVar15 * 4;
        uVar19 = 0;
        do {
          fVar1 = pfVar9[lVar12 * iVar4 + uVar19];
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            __assert_fail("coefficient != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                          ,0x5ec,"void stbir__resample_horizontal_upsample(stbir__info *, float *)")
            ;
          }
          if (0 < (int)uVar3) {
            uVar16 = 0;
            do {
              pfVar13[uVar16] = *(float *)(lVar20 + uVar16 * 4) * fVar1 + pfVar13[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar3 != uVar16);
          }
          uVar19 = uVar19 + 1;
          lVar20 = lVar20 + lVar11 * 4;
        } while (uVar19 != (iVar6 - iVar5) + 1);
      }
      lVar12 = lVar12 + 1;
      pfVar14 = pfVar14 + iVar4;
      pfVar13 = pfVar13 + lVar11;
    } while (lVar12 != iVar2);
  }
  return;
}

Assistant:

static void stbir__resample_horizontal_upsample(stbir__info* stbir_info, float* output_buffer)
{
    int x, k;
    int output_w = stbir_info->output_w;
    int channels = stbir_info->channels;
    float* decode_buffer = stbir__get_decode_buffer(stbir_info);
    stbir__contributors* horizontal_contributors = stbir_info->horizontal_contributors;
    float* horizontal_coefficients = stbir_info->horizontal_coefficients;
    int coefficient_width = stbir_info->horizontal_coefficient_width;

    for (x = 0; x < output_w; x++)
    {
        int n0 = horizontal_contributors[x].n0;
        int n1 = horizontal_contributors[x].n1;

        int out_pixel_index = x * channels;
        int coefficient_group = coefficient_width * x;
        int coefficient_counter = 0;

        STBIR_ASSERT(n1 >= n0);
        STBIR_ASSERT(n0 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 >= -stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n0 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);
        STBIR_ASSERT(n1 < stbir_info->input_w + stbir_info->horizontal_filter_pixel_margin);

        switch (channels) {
            case 1:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 1;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                }
                break;
            case 2:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 2;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                }
                break;
            case 3:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 3;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                }
                break;
            case 4:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * 4;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    STBIR_ASSERT(coefficient != 0);
                    output_buffer[out_pixel_index + 0] += decode_buffer[in_pixel_index + 0] * coefficient;
                    output_buffer[out_pixel_index + 1] += decode_buffer[in_pixel_index + 1] * coefficient;
                    output_buffer[out_pixel_index + 2] += decode_buffer[in_pixel_index + 2] * coefficient;
                    output_buffer[out_pixel_index + 3] += decode_buffer[in_pixel_index + 3] * coefficient;
                }
                break;
            default:
                for (k = n0; k <= n1; k++)
                {
                    int in_pixel_index = k * channels;
                    float coefficient = horizontal_coefficients[coefficient_group + coefficient_counter++];
                    int c;
                    STBIR_ASSERT(coefficient != 0);
                    for (c = 0; c < channels; c++)
                        output_buffer[out_pixel_index + c] += decode_buffer[in_pixel_index + c] * coefficient;
                }
                break;
        }
    }
}